

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitIf(OptimizeInstructions *this,If *curr)

{
  bool bVar1;
  Expression *pEVar2;
  undefined7 extraout_var;
  Block *this_00;
  Drop *pDVar3;
  byte bVar4;
  MixedArena *this_01;
  undefined8 unaff_R15;
  ulong uVar6;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  Builder local_190;
  Builder builder;
  bool local_b0;
  ulong uVar5;
  
  pEVar2 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar2;
  if (curr->ifFalse == (Expression *)0x0) {
    return;
  }
  if ((pEVar2->_id == UnaryId) && (*(int *)(pEVar2 + 1) == 0x14)) {
    curr->condition = (Expression *)pEVar2[1].type.id;
    pEVar2 = curr->ifTrue;
    curr->ifTrue = curr->ifFalse;
    curr->ifFalse = pEVar2;
  }
  if (((curr->condition->type).id != 1) &&
     (bVar1 = ExpressionAnalyzer::equal(curr->ifTrue,curr->ifFalse), bVar1)) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)&stack0xfffffffffffffe70,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,curr->condition);
    uVar6 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    if (local_b0 == false) {
      bVar1 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe70);
      uVar6 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&stack0xffffffffffffffa0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&stack0xffffffffffffff70);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&stack0xffffffffffffff18);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&stack0xfffffffffffffee8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&stack0xfffffffffffffeb8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&stack0xfffffffffffffe88);
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id < 2) {
      bVar1 = false;
    }
    else {
      bVar1 = (curr->ifTrue->type).id == 1;
    }
    local_190.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    bVar4 = (byte)(uVar6 & 0xffffffff) | bVar1;
    uVar5 = CONCAT71((int7)((uVar6 & 0xffffffff) >> 8),bVar4);
    if (bVar4 == 0) {
      this_00 = (Block *)curr->ifTrue;
    }
    else if (bVar1 == false) {
      pEVar2 = curr->condition;
      pDVar3 = (Drop *)MixedArena::allocSpace(&(local_190.wasm)->allocator,0x18,8);
      (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar3->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar3->value = pEVar2;
      Drop::finalize(pDVar3);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar5;
      this_00 = Builder::makeSequence
                          (&stack0xfffffffffffffe70,(Expression *)pDVar3,curr->ifTrue,type);
    }
    else {
      this_01 = &(local_190.wasm)->allocator;
      this_00 = (Block *)MixedArena::allocSpace(this_01,0x40,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_00->name).super_IString.str._M_len = 0;
      (this_00->name).super_IString.str._M_str = (char *)0x0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_00->list).allocator = this_01;
      if ((char)uVar6 != '\0') {
        pDVar3 = Builder::makeDrop(&stack0xfffffffffffffe70,curr->condition);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pDVar3);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 curr->ifTrue);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
      Block::finalize(this_00,type_,Unknown);
    }
    replaceCurrent(this,(Expression *)this_00);
    return;
  }
  optimizeTernary<wasm::If>(this,curr);
  return;
}

Assistant:

void visitIf(If* curr) {
    curr->condition = optimizeBoolean(curr->condition);
    if (curr->ifFalse) {
      if (auto* unary = curr->condition->dynCast<Unary>()) {
        if (unary->op == EqZInt32) {
          // flip if-else arms to get rid of an eqz
          curr->condition = unary->value;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
      if (curr->condition->type != Type::unreachable &&
          ExpressionAnalyzer::equal(curr->ifTrue, curr->ifFalse)) {
        // The sides are identical, so fold. If we can replace the If with one
        // arm and there are no side effects in the condition, replace it. But
        // make sure not to change a concrete expression to an unreachable
        // expression because we want to avoid having to refinalize.
        bool needCondition = effects(curr->condition).hasSideEffects();
        bool wouldBecomeUnreachable =
          curr->type.isConcrete() && curr->ifTrue->type == Type::unreachable;
        Builder builder(*getModule());
        if (!wouldBecomeUnreachable && !needCondition) {
          return replaceCurrent(curr->ifTrue);
        } else if (!wouldBecomeUnreachable) {
          return replaceCurrent(builder.makeSequence(
            builder.makeDrop(curr->condition), curr->ifTrue));
        } else {
          // Emit a block with the original concrete type.
          auto* ret = builder.makeBlock();
          if (needCondition) {
            ret->list.push_back(builder.makeDrop(curr->condition));
          }
          ret->list.push_back(curr->ifTrue);
          ret->finalize(curr->type);
          return replaceCurrent(ret);
        }
      }
      optimizeTernary(curr);
    }
  }